

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O0

void __thiscall
soplex::
SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scale(SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp,bool persistent)

{
  type_conflict5 tVar1;
  Verbosity VVar2;
  element_type *this_00;
  SPxOut *_spxout;
  byte in_DL;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long *in_RDI;
  Verbosity old_verbosity_7;
  Verbosity old_verbosity_6;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  int count;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p1prev;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p0prev;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p0;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  colscale;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  rowscale;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  bool geoscale;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p1start;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p0start;
  bool colFirst;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  Verbosity old_verbosity;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffff178;
  int in_stack_fffffffffffff17c;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff180;
  __normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  in_stack_fffffffffffff188;
  __normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  in_stack_fffffffffffff190;
  size_type in_stack_fffffffffffff198;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_stack_fffffffffffff1a0;
  DataArray<int> *in_stack_fffffffffffff1f0;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_stack_fffffffffffff1f8;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff200;
  type_conflict5 local_da2;
  type_conflict5 local_d82;
  undefined1 *local_d68;
  undefined1 *local_d48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *epsilon_00;
  DataArray<int> *colscaleExp_00;
  DataArray<int> *in_stack_fffffffffffff348;
  SPxOut *in_stack_fffffffffffff350;
  SPxOut *in_stack_fffffffffffff358;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff360;
  undefined1 local_c80 [56];
  undefined1 local_c48 [56];
  undefined1 local_c10 [56];
  undefined1 local_bd8 [56];
  undefined4 in_stack_fffffffffffff460;
  undefined4 in_stack_fffffffffffff464;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_stack_fffffffffffff468;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_stack_fffffffffffff470;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff478;
  undefined1 local_b60 [56];
  undefined1 local_b28 [56];
  undefined1 local_af0 [56];
  undefined4 local_ab8;
  Verbosity local_ab4;
  undefined1 local_ab0 [56];
  undefined8 local_a78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a68;
  undefined8 local_a60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a50;
  long local_a48;
  long local_a40;
  undefined4 local_a34;
  Verbosity local_a30;
  undefined1 local_a2c [56];
  undefined1 local_9f4 [56];
  undefined1 local_9bc [56];
  undefined1 local_984 [56];
  undefined1 local_94c [56];
  undefined1 local_914 [56];
  undefined4 local_8dc;
  Verbosity local_8d8;
  undefined1 local_8d4 [56];
  undefined1 local_89c [56];
  undefined1 local_864 [56];
  undefined1 local_82c [56];
  undefined1 local_7f4 [56];
  undefined1 local_7bc [56];
  undefined1 local_784 [56];
  undefined1 local_74c [56];
  int local_714;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_710;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6d8;
  undefined8 local_6a0;
  undefined1 local_698 [56];
  undefined8 local_660;
  undefined1 local_654 [60];
  undefined8 local_618;
  undefined1 local_610 [87];
  undefined1 local_5b9 [93];
  undefined4 local_55c;
  Verbosity local_558 [3];
  type_conflict5 local_549;
  undefined1 local_548 [56];
  undefined1 local_510 [56];
  undefined1 local_4d8 [56];
  undefined1 local_4a0 [56];
  undefined4 local_468;
  Verbosity local_464;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_460;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_428;
  byte local_3ed;
  Real local_3d0;
  undefined1 local_3c4 [56];
  undefined1 local_38c [56];
  undefined1 local_354 [56];
  undefined4 local_31c;
  Verbosity local_318;
  byte local_311;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_310;
  undefined8 local_300;
  Real *local_2f8;
  undefined1 *local_2f0;
  undefined8 local_2e8;
  undefined1 *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  undefined8 local_2d0;
  undefined8 *local_2c8;
  undefined1 *local_2c0;
  undefined8 local_2b8;
  undefined8 *local_2b0;
  undefined1 *local_2a8;
  undefined8 local_2a0;
  undefined8 *local_298;
  undefined1 *local_290;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  undefined1 *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  undefined1 *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  undefined1 *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  undefined1 *local_110;
  Real *local_108;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_f9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_311 = in_DL & 1;
  local_310 = in_RSI;
  if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 2 < (int)VVar2)) {
    local_318 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_31c = 3;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_31c);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                       (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                       (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                       (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                       (_func_ostream_ptr_ostream_ptr *)
                       CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_318);
  }
  (**(code **)*in_RDI)(in_RDI,local_310);
  (**(code **)(*in_RDI + 0x198))(local_354,in_RDI,local_310);
  (**(code **)(*in_RDI + 0x1a0))(local_38c,in_RDI,local_310);
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x3b7425);
  local_3d0 = Tolerances::epsilon(this_00);
  local_2f0 = local_3c4;
  local_2f8 = &local_3d0;
  local_300 = 0;
  local_108 = local_2f8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&(in_stack_fffffffffffff190._M_current)->m_backend,
             (double)in_stack_fffffffffffff188._M_current,in_stack_fffffffffffff180);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3b74b4);
  local_3ed = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3b74c9);
  local_288 = &local_428;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff180);
  local_280 = &local_460;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff180);
  if ((local_3ed & 1) == 0) {
    local_150 = &local_428;
    local_158 = local_38c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_stack_fffffffffffff180,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    local_160 = &local_460;
    local_168 = local_354;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_stack_fffffffffffff180,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
  }
  else {
    local_130 = &local_428;
    local_138 = local_354;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_stack_fffffffffffff180,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    local_140 = &local_460;
    local_148 = local_38c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_stack_fffffffffffff180,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
  }
  if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar2)) {
    local_464 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_468 = 4;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_468);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                       (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    in_stack_fffffffffffff348 =
         (DataArray<int> *)
         soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                            (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    (*(local_310->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(local_4a0,local_310,1);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    in_stack_fffffffffffff350 =
         soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                            (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    (*(local_310->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(local_4d8,local_310,1);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    in_stack_fffffffffffff358 =
         soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                            (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    local_270 = local_510;
    local_278 = local_354;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff180,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    in_stack_fffffffffffff360 =
         (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178)
                              );
    local_260 = local_548;
    local_268 = local_38c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff180,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                       (_func_ostream_ptr_ostream_ptr *)
                       CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_464);
  }
  local_549 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3b783a);
  if (!local_549) {
    if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar2)) {
      local_558[2] = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      local_558[1] = 4;
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_558 + 1);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_558 + 2);
    }
    if ((*(byte *)(in_RDI + 8) & 1) == 0) {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setScalingInfo(local_310,true);
      return;
    }
    if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar2)) {
      local_558[0] = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      local_55c = 4;
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_55c);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_558);
    }
  }
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3b79ef);
  local_5b9._1_8_ = 0x3ff0000000000000;
  epsilon_00 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(local_5b9 + 9);
  local_2e0 = local_5b9 + 1;
  local_2e8 = 0;
  local_2d8 = epsilon_00;
  local_110 = local_2e0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&(in_stack_fffffffffffff190._M_current)->m_backend,
             (double)in_stack_fffffffffffff188._M_current,in_stack_fffffffffffff180);
  colscaleExp_00 = (DataArray<int> *)local_5b9;
  std::
  allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocator((allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x3b7a81);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,in_stack_fffffffffffff190._M_current,
           (allocator_type *)in_stack_fffffffffffff188._M_current);
  std::
  allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~allocator((allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x3b7ab5);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3b7ac2);
  local_618 = 0x3ff0000000000000;
  local_2c0 = local_610;
  local_2c8 = &local_618;
  local_2d0 = 0;
  local_118 = local_2c8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&(in_stack_fffffffffffff190._M_current)->m_backend,
             (double)in_stack_fffffffffffff188._M_current,in_stack_fffffffffffff180);
  std::
  allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocator((allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x3b7b60);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::vector(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,in_stack_fffffffffffff190._M_current,
           (allocator_type *)in_stack_fffffffffffff188._M_current);
  std::
  allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~allocator((allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x3b7b94);
  local_660 = 0;
  local_2a8 = local_654;
  local_2b0 = &local_660;
  local_2b8 = 0;
  local_120 = local_2b0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&(in_stack_fffffffffffff190._M_current)->m_backend,
             (double)in_stack_fffffffffffff188._M_current,in_stack_fffffffffffff180);
  local_6a0 = 0;
  local_290 = local_698;
  local_298 = &local_6a0;
  local_2a0 = 0;
  local_128 = local_298;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&(in_stack_fffffffffffff190._M_current)->m_backend,
             (double)in_stack_fffffffffffff188._M_current,in_stack_fffffffffffff180);
  if ((local_549 & 1U) != 0) {
    local_250 = &local_6d8;
    local_258 = &local_428;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff180,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    local_240 = &local_710;
    local_248 = &local_460;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff180,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    for (local_714 = 0; local_714 < *(int *)((long)in_RDI + 0x44); local_714 = local_714 + 1) {
      if ((local_3ed & 1) == 0) {
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::rowSet(&local_310->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                );
        local_210 = local_864;
        local_218 = local_3c4;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff180,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (in_stack_fffffffffffff478,in_stack_fffffffffffff470,in_stack_fffffffffffff468,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
        local_1b0 = local_654;
        local_1b8 = local_82c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_fffffffffffff180,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::colSet(&local_310->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                );
        local_200 = local_8d4;
        local_208 = local_3c4;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff180,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (in_stack_fffffffffffff478,in_stack_fffffffffffff470,in_stack_fffffffffffff468,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
        local_1c0 = local_698;
        local_1c8 = local_89c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_fffffffffffff180,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      }
      else {
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::colSet(&local_310->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                );
        local_230 = local_784;
        local_238 = local_3c4;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff180,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (in_stack_fffffffffffff478,in_stack_fffffffffffff470,in_stack_fffffffffffff468,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
        local_190 = local_654;
        local_198 = local_74c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_fffffffffffff180,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::rowSet(&local_310->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                );
        local_220 = local_7f4;
        local_228 = local_3c4;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff180,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (in_stack_fffffffffffff478,in_stack_fffffffffffff470,in_stack_fffffffffffff468,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
        local_1a0 = local_698;
        local_1a8 = local_7bc;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_fffffffffffff180,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      }
      if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 4 < (int)VVar2)) {
        local_8d8 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
        local_8dc = 5;
        (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_8dc);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                           (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,in_stack_fffffffffffff17c);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                           (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        if ((local_3ed & 1) == 0) {
          local_d48 = local_698;
        }
        else {
          local_d48 = local_654;
        }
        local_1f0 = local_914;
        local_1f8 = local_d48;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff180,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                           (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        if ((local_3ed & 1) == 0) {
          local_d68 = local_654;
        }
        else {
          local_d68 = local_698;
        }
        local_1e0 = local_94c;
        local_1e8 = local_d68;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff180,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                           (_func_ostream_ptr_ostream_ptr *)
                           CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_8d8);
      }
      local_30 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(in_RDI + 9);
      local_38 = &local_6d8;
      local_28 = local_984;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,local_30,local_38);
      local_20 = local_984;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff180);
      local_10 = local_30;
      local_18 = local_38;
      local_8 = local_984;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_fffffffffffff180,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                 (cpp_dec_float<50U,_int,_void> *)0x3b8388);
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3b83a1);
      local_d82 = false;
      if (tVar1) {
        local_70 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(in_RDI + 9);
        local_78 = &local_710;
        local_68 = local_9bc;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_79,local_70,local_78);
        local_60 = local_9bc;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff180);
        local_50 = local_70;
        local_58 = local_78;
        local_48 = local_9bc;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (in_stack_fffffffffffff180,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                   (cpp_dec_float<50U,_int,_void> *)0x3b8487);
        local_d82 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x3b84a0);
      }
      if (local_d82 != false) break;
      local_170 = &local_6d8;
      local_178 = local_654;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_fffffffffffff180,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      local_180 = &local_710;
      local_188 = local_698;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_fffffffffffff180,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    }
    local_b0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(in_RDI + 9);
    local_b8 = &local_428;
    local_a8 = local_9f4;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_b9,local_b0,local_b8);
    local_a0 = local_9f4;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff180);
    local_90 = local_b0;
    local_98 = local_b8;
    local_88 = local_9f4;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (in_stack_fffffffffffff180,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
               (cpp_dec_float<50U,_int,_void> *)0x3b860e);
    tVar1 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3b8627);
    local_da2 = true;
    if (!tVar1) {
      local_f0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(in_RDI + 9);
      local_f8 = &local_460;
      local_e8 = local_a2c;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_f9,local_f0,local_f8);
      local_e0 = local_a2c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff180);
      local_d0 = local_f0;
      local_d8 = local_f8;
      local_c8 = local_a2c;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_fffffffffffff180,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                 (cpp_dec_float<50U,_int,_void> *)0x3b870e);
      local_da2 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x3b8727);
    }
    local_549 = local_da2;
  }
  if (((local_549 & 1U) == 0) && ((*(byte *)(in_RDI + 8) & 1) == 0)) {
    if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar2)) {
      local_a30 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      local_a34 = 4;
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_a34);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_a30);
    }
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setScalingInfo(local_310,true);
  }
  else {
    local_a40 = in_RDI[2];
    local_a48 = in_RDI[3];
    if ((*(byte *)(in_RDI + 8) & 1) == 0) {
      SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::computeExpVec(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0)
      ;
      SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::computeExpVec(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f0)
      ;
    }
    else {
      if ((local_549 & 1U) == 0) {
        local_a50 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)std::
                       vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ::begin((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        local_a58 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)std::
                       vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ::end((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        local_a60 = 0x3ff0000000000000;
        std::
        fill<__gnu_cxx::__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>*,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>>,double>
                  (in_stack_fffffffffffff190,in_stack_fffffffffffff188,
                   (double *)in_stack_fffffffffffff180);
        local_a68 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)std::
                       vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ::begin((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        local_a70 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)std::
                       vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ::end((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
        local_a78 = 0x3ff0000000000000;
        std::
        fill<__gnu_cxx::__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>*,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>>,double>
                  (in_stack_fffffffffffff190,in_stack_fffffffffffff188,
                   (double *)in_stack_fffffffffffff180);
      }
      local_1d0 = local_ab0;
      local_1d8 = local_3c4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff180,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::computePostequiExpVecs
                (in_stack_fffffffffffff360,
                 (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *)in_stack_fffffffffffff358,
                 (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *)in_stack_fffffffffffff350,in_stack_fffffffffffff348,colscaleExp_00,epsilon_00);
    }
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_310);
    if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 4 < (int)VVar2)) {
      local_ab4 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      local_ab8 = 5;
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_ab8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      (**(code **)(*in_RDI + 0x188))(local_af0);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      (**(code **)(*in_RDI + 400))(local_b28);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      (**(code **)(*in_RDI + 0x178))(local_b60);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      (**(code **)(*in_RDI + 0x180))(&stack0xfffffffffffff468);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_ab4);
    }
    if ((in_RDI[5] != 0) && (VVar2 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar2)) {
      SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&stack0xfffffffffffff460);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      (*(local_310->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[3])(local_bd8,local_310,0);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      (*(local_310->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[4])(local_c10,local_310,0);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      (**(code **)(*in_RDI + 0x198))(local_c48,in_RDI,local_310);
      in_stack_fffffffffffff190._M_current =
           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                         (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      (**(code **)(*in_RDI + 0x1a0))(local_c80,in_RDI,local_310);
      _spxout = soplex::operator<<((SPxOut *)in_stack_fffffffffffff180,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178))
      ;
      soplex::operator<<(_spxout,(_func_ostream_ptr_ostream_ptr *)
                                 CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&stack0xfffffffffffff464);
    }
  }
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)in_stack_fffffffffffff190._M_current);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)in_stack_fffffffffffff190._M_current);
  return;
}

Assistant:

void SPxGeometSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Geometric scaling LP" <<
                 (persistent ? " (persistent)" : "") << (postequilibration ? " with post-equilibration" : "") <<
                 std::endl;)

   this->setup(lp);

   /* We want to do that direction first, with the lower ratio.
    * See SPxEquiliSC<R>::scale() for a reasoning.
    */
   const R colratio = this->maxColRatio(lp);
   const R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   const bool colFirst = colratio < rowratio;

   R p0start;
   R p1start;

   if(colFirst)
   {
      p0start = colratio;
      p1start = rowratio;
   }
   else
   {
      p0start = rowratio;
      p1start = colratio;
   }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   // perform geometric scaling only if maximum ratio is above threshold
   bool geoscale = p1start > m_goodEnoughRatio;

   if(!geoscale)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done, ratio good enough" <<
                    std::endl;)

      if(!postequilibration)
      {
         lp.setScalingInfo(true);
         return;
      }

      SPX_MSG_INFO2((*this->spxout),
                    (*this->spxout) << " ... but will still perform equilibrium scaling" <<
                    std::endl;)
   }

   std::vector<R> rowscale(unsigned(lp.nRows()), 1.0);
   std::vector<R> colscale(unsigned(lp.nCols()), 1.0);

   R p0 = 0.0;
   R p1 = 0.0;

   if(geoscale)
   {
      R p0prev = p0start;
      R p1prev = p1start;

      // we make at most maxIterations.
      for(int count = 0; count < m_maxIterations; count++)
      {
         if(colFirst)
         {
            p0 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
            p1 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
         }
         else
         {
            p0 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
            p1 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
         }

         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Geometric scaling round " << count
                       << " col-ratio= " << (colFirst ? p0 : p1)
                       << " row-ratio= " << (colFirst ? p1 : p0)
                       << std::endl;)

         if(p0 > m_minImprovement * p0prev && p1 > m_minImprovement * p1prev)
            break;

         p0prev = p0;
         p1prev = p1;
      }

      // perform geometric scaling only if there is enough (default 15%) improvement.
      geoscale = (p0 <= m_minImprovement * p0start || p1 <= m_minImprovement * p1start);
   }

   if(!geoscale && !postequilibration)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done." << std::endl;)
      lp.setScalingInfo(true);
   }
   else
   {
      DataArray<int>& colscaleExp = *this->m_activeColscaleExp;
      DataArray<int>& rowscaleExp = *this->m_activeRowscaleExp;

      if(postequilibration)
      {
         if(!geoscale)
         {
            std::fill(rowscale.begin(), rowscale.end(), 1.0);
            std::fill(colscale.begin(), colscale.end(), 1.0);
         }

         SPxEquiliSC<R>::computePostequiExpVecs(lp, rowscale, colscale, rowscaleExp, colscaleExp, epsilon);
      }
      else
      {
         this->computeExpVec(colscale, colscaleExp);
         this->computeExpVec(rowscale, rowscaleExp);
      }

      this->applyScaling(lp);

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                    << " max= " << this->maxAbsRowscale()
                    << std::endl
                    << "IGEOSC06 Col scaling min= " << this->minAbsColscale()
                    << " max= " << this->maxAbsColscale()
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                    << " min= " << lp.minAbsNzo(false)
                    << " max= " << lp.maxAbsNzo(false)
                    << " col-ratio= " << this->maxColRatio(lp)
                    << " row-ratio= " << this->maxRowRatio(lp)
                    << std::endl;)
   }
}